

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O1

jieba_token_t *
jieba_tokenize(jieba_t *handle,char *sentence,jieba_tokenize_mode_t mode,int is_hmm_used)

{
  jieba_token_t *pjVar1;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> words;
  allocator local_49;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> local_48;
  string local_30;
  
  local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (mode == JIEBA_TOKENIZE_MODE_SEARCH) {
    std::__cxx11::string::string((string *)&local_30,sentence,&local_49);
    cppjieba::QuerySegment::Cut
              ((QuerySegment *)(handle + 0x448),&local_30,&local_48,is_hmm_used != 0);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,sentence,&local_49);
    cppjieba::MixSegment::Cut((MixSegment *)(handle + 0x310),&local_30,&local_48,is_hmm_used != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  pjVar1 = convert_tokens(&local_48);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector(&local_48);
  return pjVar1;
}

Assistant:

jieba_token_t* jieba_tokenize(jieba_t* handle, const char* sentence, jieba_tokenize_mode_t mode, int is_hmm_used) {
  std::vector<cppjieba::Word> words;
  switch (mode) {
    case JIEBA_TOKENIZE_MODE_SEARCH:
      ((cppjieba::Jieba*)handle)->CutForSearch(sentence, words, is_hmm_used);
      return convert_tokens(words);
    default:
      ((cppjieba::Jieba*)handle)->Cut(sentence, words, is_hmm_used);
      return convert_tokens(words);
  }
}